

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputStream.cpp
# Opt level: O3

int __thiscall cali::OutputStream::OutputStreamImpl::init(OutputStreamImpl *this,EVP_PKEY_CTX *ctx)

{
  char cVar1;
  int in_EAX;
  int iVar2;
  ostream *poVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  path parent;
  path pStack_258;
  undefined1 local_230 [248];
  ios_base local_138 [264];
  int local_30;
  
  if (this->is_initialized == false) {
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->init_mutex);
    if (iVar2 != 0) {
      std::__throw_system_error(iVar2);
    }
    this->is_initialized = true;
    if (this->type == File) {
      std::filesystem::__cxx11::path::parent_path();
      if ((pStack_258._M_pathname._M_string_length != 0) &&
         (cVar1 = std::filesystem::create_directories(&pStack_258), cVar1 != '\0')) {
        poVar3 = (ostream *)local_230;
        std::ofstream::ofstream(poVar3);
        local_30 = 2;
        iVar2 = Log::verbosity();
        if (local_30 <= iVar2) {
          poVar3 = Log::get_stream((Log *)local_230);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,"OutputStream: created directories for ",0x26);
        pbVar4 = std::filesystem::__cxx11::operator<<(poVar3,&this->filename);
        std::ios::widen((char)*(undefined8 *)(*(long *)pbVar4 + -0x18) + (char)pbVar4);
        std::ostream::put((char)pbVar4);
        std::ostream::flush();
        local_230._0_8_ = _VTT;
        *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = ___throw_bad_array_new_length;
        std::filebuf::~filebuf((filebuf *)(local_230 + 8));
        std::ios_base::~ios_base(local_138);
      }
      std::filesystem::__cxx11::path::~path(&pStack_258);
      std::ofstream::open((char *)&this->fs,
                          (_Ios_Openmode)(this->filename)._M_pathname._M_dataplus._M_p);
      cVar1 = std::__basic_file<char>::is_open();
      if (cVar1 == '\0') {
        this->type = None;
        poVar3 = (ostream *)local_230;
        std::ofstream::ofstream(poVar3);
        local_30 = 0;
        iVar2 = Log::verbosity();
        if (local_30 <= iVar2) {
          poVar3 = Log::get_stream((Log *)local_230);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,"Could not open output stream ",0x1d);
        pbVar4 = std::filesystem::__cxx11::operator<<(poVar3,&this->filename);
        std::ios::widen((char)*(undefined8 *)(*(long *)pbVar4 + -0x18) + (char)pbVar4);
        std::ostream::put((char)pbVar4);
        std::ostream::flush();
        local_230._0_8_ = _VTT;
        *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = ___throw_bad_array_new_length;
        std::filebuf::~filebuf((filebuf *)(local_230 + 8));
        std::ios_base::~ios_base(local_138);
      }
    }
    in_EAX = pthread_mutex_unlock((pthread_mutex_t *)&this->init_mutex);
  }
  return in_EAX;
}

Assistant:

void init()
    {
        if (is_initialized)
            return;

        std::lock_guard<std::mutex> g(init_mutex);

        is_initialized = true;

        if (type == StreamType::File) {
            check_and_create_directory(filename);
            fs.open(filename, mode == Mode::Append ? std::ios::app : std::ios::trunc);

            if (!fs.is_open()) {
                type = StreamType::None;

                Log(0).stream() << "Could not open output stream " << filename << std::endl;
            }
        }
    }